

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
emplaceRealloc<slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::EdgeKind&,std::span<std::array<char,2ul>,18446744073709551615ul>>
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,pointer pos,
          Expression *args,Expression **args_1,EdgeKind *args_2,
          span<std::array<char,_2UL>,_18446744073709551615UL> *args_3)

{
  EdgeKind edge;
  size_type sVar1;
  Expression *condition;
  size_type sVar2;
  size_type sVar3;
  iterator pAVar4;
  long lVar5;
  pointer pAVar6;
  iterator __last;
  undefined8 *in_RCX;
  Expression *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *in_RDI;
  EdgeKind *in_R8;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  Arg *in_stack_ffffffffffffff50;
  Arg *in_stack_ffffffffffffff58;
  size_type in_stack_ffffffffffffff60;
  iterator __first;
  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *in_stack_ffffffffffffff68;
  pointer this_00;
  span<const_std::array<char,_2UL>,_18446744073709551615UL> local_60;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *)0x7dd812);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  __first = in_RSI;
  pAVar4 = begin(in_RDI);
  lVar5 = (long)__first - (long)pAVar4;
  pAVar6 = (pointer)operator_new(0x7dd87d);
  condition = (Expression *)*in_RCX;
  edge = *in_R8;
  this_00 = pAVar6 + lVar5 / 0x28;
  std::span<const_std::array<char,_2UL>,_18446744073709551615UL>::
  span<std::array<char,_2UL>,_18446744073709551615UL>
            ((span<const_std::array<char,_2UL>,_18446744073709551615UL> *)__first,
             (span<std::array<char,_2UL>,_18446744073709551615UL> *)in_stack_ffffffffffffff58);
  slang::ast::SystemTimingCheckSymbol::Arg::Arg(this_00,in_RDX,condition,edge,local_60);
  pAVar4 = end(in_RDI);
  if (in_RSI == pAVar4) {
    __last = begin(in_RDI);
    pAVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::SystemTimingCheckSymbol::Arg*,slang::ast::SystemTimingCheckSymbol::Arg*>
              (__first,__last,in_stack_ffffffffffffff50);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::ast::SystemTimingCheckSymbol::Arg*,slang::ast::SystemTimingCheckSymbol::Arg*>
              (__first,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    pAVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::SystemTimingCheckSymbol::Arg*,slang::ast::SystemTimingCheckSymbol::Arg*>
              (__first,in_stack_ffffffffffffff58,in_RSI);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pAVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pAVar6;
  return pAVar6 + lVar5 / 0x28;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}